

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

void Ring_off_or_gone(obj *obj,boolean gone)

{
  schar sVar1;
  schar sVar2;
  uint mask_00;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  int local_30;
  int which;
  int old_attrib;
  long oldprop;
  long mask;
  boolean gone_local;
  obj *obj_local;
  
  if (obj == (obj *)0x0) {
    return;
  }
  mask_00 = obj->owornmask & 0x60000;
  uVar3 = u.uprops[objects[obj->otyp].oc_oprop].extrinsic;
  Oprops_off(obj,mask_00);
  takeoff_mask = ((ulong)mask_00 ^ 0xffffffffffffffff) & takeoff_mask;
  if ((u.uprops[objects[obj->otyp].oc_oprop].extrinsic & mask_00) == 0) {
    warning("Strange... I didn\'t know you had that ring.");
  }
  if (gone == '\0') {
    setworn((obj *)0x0,(long)obj->owornmask);
  }
  else {
    setnotworn(obj);
  }
  if ((uVar3 & 0x60000) != 0x60000) {
    uVar3 = uVar3 & 0xfff9ffff;
  }
  switch(obj->otyp) {
  case 0x9d:
    local_30 = 5;
    goto LAB_001b4db5;
  case 0x9e:
    local_30 = 0;
    goto LAB_001b4db5;
  case 0x9f:
    local_30 = 4;
    goto LAB_001b4db5;
  case 0xa0:
    local_30 = 1;
    goto LAB_001b4db5;
  case 0xa1:
    local_30 = 2;
    goto LAB_001b4db5;
  case 0xa2:
    local_30 = 3;
LAB_001b4db5:
    sVar1 = acurr(local_30);
    u.abon.a[local_30] = u.abon.a[local_30] - obj->spe;
    sVar2 = acurr(local_30);
    if (sVar2 != sVar1) {
      iflags.botl = '\x01';
      discover_object((int)obj->otyp,'\x01','\x01');
      *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xffffffef | 0x10;
      update_inventory();
    }
    break;
  case 0xa3:
    u.uhitinc = u.uhitinc - obj->spe;
    break;
  case 0xa4:
    u.udaminc = u.udaminc - obj->spe;
    break;
  case 0xa5:
    if (obj->spe != '\0') {
      iflags.botl = '\x01';
      discover_object(0xa5,'\x01','\x01');
      *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xffffffef | 0x10;
      update_inventory();
    }
  case 0xbb:
    restartcham();
    break;
  case 0xa6:
  case 0xa7:
  case 0xa9:
  case 0xab:
  case 0xac:
  case 0xad:
  case 0xaf:
  case 0xb0:
  case 0xb1:
  case 0xb2:
  case 0xb3:
  case 0xb4:
  case 0xb5:
  case 0xb6:
  case 0xb7:
  case 0xb8:
  case 0x113:
    break;
  case 0xa8:
    if (((uVar3 == 0) && (u.uprops[0x13].intrinsic == 0)) && (u.uprops[0x13].blocked == 0)) {
      discover_object(0xa8,'\x01','\x01');
      pline("You sure are noisy.");
    }
    break;
  case 0xaa:
    float_down(0,0);
    if (((u.uprops[0x12].intrinsic == 0) && (u.uprops[0x12].extrinsic == 0)) &&
       ((youmonst.data)->mlet != '\x05')) {
      discover_object(0xaa,'\x01','\x01');
    }
    break;
  case 0xae:
    see_monsters();
    break;
  case 0xb9:
    if ((((((u.uprops[0xd].intrinsic == 0) && (u.uprops[0xd].extrinsic == 0)) &&
          ((youmonst.data != mons + 0x9e && (youmonst.data != mons + 0x7b)))) ||
         (u.uprops[0xd].blocked != 0)) && (u.uprops[0xd].blocked == 0)) &&
       (((u.uprops[0x1e].intrinsic == 0 &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
      newsym((int)u.ux,(int)u.uy);
      bVar5 = true;
      if ((u.uprops[0xc].intrinsic == 0) && (bVar5 = true, u.uprops[0xc].extrinsic == 0)) {
        bVar5 = ((youmonst.data)->mflags1 & 0x1000000) != 0;
      }
      pcVar4 = "..";
      if (bVar5) {
        pcVar4 = " completely";
      }
      pline("Your body seems to unfade%s.",pcVar4);
      discover_object(0xb9,'\x01','\x01');
    }
    break;
  case 0xba:
    if (((u.uprops[0xc].intrinsic == 0) && (u.uprops[0xc].extrinsic == 0)) &&
       (((youmonst.data)->mflags1 & 0x1000000) == 0)) {
      set_mimic_blocking();
      see_monsters();
    }
    if ((((u.uprops[0xd].intrinsic != 0) || (u.uprops[0xd].extrinsic != 0)) ||
        ((youmonst.data == mons + 0x9e || (youmonst.data == mons + 0x7b)))) &&
       ((((u.uprops[0xd].blocked == 0 && (u.uprops[0xc].intrinsic == 0)) &&
         ((u.uprops[0xc].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000000) == 0)))) &&
        (((u.uprops[0x1e].intrinsic == 0 &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))))) {
      newsym((int)u.ux,(int)u.uy);
      pline("Suddenly you cannot see yourself.");
      discover_object(0xba,'\x01','\x01');
    }
  }
  return;
}

Assistant:

static void Ring_off_or_gone(struct obj *obj, boolean gone)
{
    long mask;
    long oldprop;
    int old_attrib, which;

    if (!obj) return;

    mask = (obj->owornmask & W_RING);
    oldprop = u.uprops[objects[obj->otyp].oc_oprop].extrinsic;

    Oprops_off(obj, mask);

    takeoff_mask &= ~mask;
    if (!(u.uprops[objects[obj->otyp].oc_oprop].extrinsic & mask))
	warning("Strange... I didn't know you had that ring.");
    if (gone) setnotworn(obj);
    else setworn(NULL, obj->owornmask);

    /* only mask out W_RING when we don't have both
       left and right rings of the same type */
    if ((oldprop & W_RING) != W_RING) oldprop &= ~W_RING;

    switch(obj->otyp) {
	case RIN_TELEPORTATION:
	case RIN_REGENERATION:
	case RIN_SEARCHING:
	case RIN_HUNGER:
	case RIN_AGGRAVATE_MONSTER:
	case RIN_POISON_RESISTANCE:
	case RIN_FIRE_RESISTANCE:
	case RIN_COLD_RESISTANCE:
	case RIN_SHOCK_RESISTANCE:
	case RIN_CONFLICT:
	case RIN_TELEPORT_CONTROL:
	case RIN_POLYMORPH:
	case RIN_POLYMORPH_CONTROL:
	case RIN_FREE_ACTION:                
	case RIN_SLOW_DIGESTION:
	case RIN_SUSTAIN_ABILITY:
	case MEAT_RING:
		break;
	case RIN_STEALTH:
		if (!oldprop && !HStealth && !BStealth) {
		    makeknown(RIN_STEALTH);
		    pline("You sure are noisy.");
		}
		break;
	case RIN_WARNING:
		see_monsters();
		break;
	case RIN_SEE_INVISIBLE:
		/* Make invisible monsters go away */
		if (!See_invisible) {
		    set_mimic_blocking(); /* do special mimic handling */
		    see_monsters();
#ifdef INVISIBLE_OBJECTS                
		    see_objects();
#endif
		}

		if (Invisible && !Blind) {
		    newsym(u.ux,u.uy);
		    pline("Suddenly you cannot see yourself.");
		    makeknown(RIN_SEE_INVISIBLE);
		}
		break;
	case RIN_INVISIBILITY:
		if (!Invis && !BInvis && !Blind) {
		    newsym(u.ux,u.uy);
		    pline("Your body seems to unfade%s.",
			 See_invisible ? " completely" : "..");
		    makeknown(RIN_INVISIBILITY);
		}
		break;
	case RIN_LEVITATION:
		float_down(0L, 0L);
		if (!Levitation) makeknown(RIN_LEVITATION);
		break;
	case RIN_GAIN_STRENGTH:
		which = A_STR;
		goto adjust_attrib;
	case RIN_GAIN_CONSTITUTION:
		which = A_CON;
		goto adjust_attrib;
	case RIN_GAIN_INTELLIGENCE:
		which = A_INT;
		goto adjust_attrib;
	case RIN_GAIN_WISDOM:
		which = A_WIS;
		goto adjust_attrib;
	case RIN_GAIN_DEXTERITY:
		which = A_DEX;
		goto adjust_attrib;
	case RIN_ADORNMENT:
		which = A_CHA;
 adjust_attrib:
		old_attrib = ACURR(which);
		ABON(which) -= obj->spe;
		if (ACURR(which) != old_attrib) {
		    iflags.botl = 1;
		    makeknown(obj->otyp);
		    obj->known = 1;
		    update_inventory();
		}
		break;
	case RIN_INCREASE_ACCURACY:	/* KMH */
		u.uhitinc -= obj->spe;
		break;
	case RIN_INCREASE_DAMAGE:
		u.udaminc -= obj->spe;
		break;
	case RIN_PROTECTION:
		/* might have forgotten it due to amnesia */
		if (obj->spe) {
		    iflags.botl = 1;
		    makeknown(RIN_PROTECTION);
		    obj->known = 1;
		    update_inventory();
		}
	case RIN_PROTECTION_FROM_SHAPE_CHANGERS:
		/* If you're no longer protected, let the chameleons
		 * change shape again -dgk
		 */
		restartcham();
		break;
    }
}